

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_outbound.hpp
# Opt level: O2

ostream * std::operator<<(ostream *os,
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *mp)

{
  _Rb_tree_node_base *p_Var1;
  ostream *os_00;
  _Self __tmp;
  
  if ((mp->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    std::operator<<(os,"{}");
  }
  else {
    std::operator<<(os,'{');
    p_Var1 = (mp->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    operator<<(os,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(p_Var1 + 1));
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    for (; (_Rb_tree_header *)p_Var1 != &(mp->_M_t)._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      os_00 = std::operator<<(os,", ");
      operator<<(os_00,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(p_Var1 + 1));
    }
    std::operator<<(os,'}');
  }
  return os;
}

Assistant:

ostream& operator << (ostream& os, const map<T1, T2>& mp)
        {
            if(mp.empty())
            {
                os<<"{}";
                return os;
            }
            os<<'{';
            typename map<T1, T2>::const_iterator it = mp.begin();
            os<<*it;
            it++;
            while(it != mp.end())
            {
                os<<", "<<*it;
                it++;
            }
            os<<'}';
            return os;
        }